

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deBlockBuffer.cpp
# Opt level: O1

void de::BlockBufferCancelTest::runTest(void)

{
  uint uVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  deBool dVar4;
  deThreadPriority dVar5;
  uint uVar6;
  Thread *pTVar7;
  long *plVar8;
  int iVar9;
  vector<de::Thread_*,_std::allocator<de::Thread_*>_> threads;
  BlockBuffer<unsigned_char> buffer;
  Random rnd;
  long *local_b8;
  long *plStack_b0;
  long local_a8;
  uint local_a0;
  deUint32 local_9c;
  Thread *local_98;
  BlockBuffer<unsigned_char> local_90;
  deRandom local_40;
  
  BlockBuffer<unsigned_char>::BlockBuffer(&local_90,0x40,0x10);
  uVar6 = 0;
  do {
    uVar1 = (uVar6 ^ 0x3d) * 9;
    uVar1 = (uVar1 >> 4 ^ uVar1) * 0x27d4eb2d;
    local_a0 = uVar6;
    deRandom_init(&local_40,uVar1 >> 0xf ^ uVar1);
    dVar2 = deRandom_getUint32(&local_40);
    dVar3 = deRandom_getUint32(&local_40);
    local_9c = dVar3 % 200 + 1;
    local_b8 = (long *)0x0;
    plStack_b0 = (long *)0x0;
    local_a8 = 0;
    iVar9 = (dVar2 & 0xf) + 1;
    do {
      dVar4 = deRandom_getBool(&local_40);
      if (dVar4 == 1) {
        pTVar7 = (Thread *)operator_new(0x28);
        dVar5 = deRandom_getUint32(&local_40);
        Thread::Thread(pTVar7);
        pTVar7->_vptr_Thread = (_func_int **)&PTR__Thread_00277bd0;
        pTVar7[1]._vptr_Thread = (_func_int **)&local_90;
        pTVar7[1].m_attribs.priority = dVar5;
        local_98 = pTVar7;
        std::vector<de::Thread*,std::allocator<de::Thread*>>::emplace_back<de::Thread*>
                  ((vector<de::Thread*,std::allocator<de::Thread*>> *)&local_b8,&local_98);
      }
      else {
        pTVar7 = (Thread *)operator_new(0x28);
        dVar5 = deRandom_getUint32(&local_40);
        Thread::Thread(pTVar7);
        pTVar7->_vptr_Thread = (_func_int **)&PTR__Thread_00277c10;
        pTVar7[1]._vptr_Thread = (_func_int **)&local_90;
        pTVar7[1].m_attribs.priority = dVar5;
        local_98 = pTVar7;
        std::vector<de::Thread*,std::allocator<de::Thread*>>::emplace_back<de::Thread*>
                  ((vector<de::Thread*,std::allocator<de::Thread*>> *)&local_b8,&local_98);
      }
      iVar9 = iVar9 + -1;
      plVar8 = local_b8;
    } while (iVar9 != 0);
    for (; plVar8 != plStack_b0; plVar8 = plVar8 + 1) {
      Thread::start((Thread *)*plVar8);
    }
    deSleep(local_9c);
    local_90.m_canceled = 1;
    deSemaphore_increment(local_90.m_empty);
    deSemaphore_increment(local_90.m_fill);
    for (plVar8 = local_b8; plVar8 != plStack_b0; plVar8 = plVar8 + 1) {
      Thread::join((Thread *)*plVar8);
    }
    BlockBuffer<unsigned_char>::clear(&local_90);
    for (plVar8 = local_b8; plVar8 != plStack_b0; plVar8 = plVar8 + 1) {
      if ((long *)*plVar8 != (long *)0x0) {
        (**(code **)(*(long *)*plVar8 + 8))();
      }
    }
    if (local_b8 != (long *)0x0) {
      operator_delete(local_b8,local_a8 - (long)local_b8);
    }
    uVar6 = local_a0 + 1;
  } while (uVar6 != 8);
  BlockBuffer<unsigned_char>::~BlockBuffer(&local_90);
  return;
}

Assistant:

void runTest (void)
{
	BlockBuffer<deUint8>	buffer			(64, 16);
	const int				numIterations	= 8;

	for (int iterNdx = 0; iterNdx < numIterations; iterNdx++)
	{
		Random				rnd				(deInt32Hash(iterNdx));
		int					numThreads		= rnd.getInt(1, 16);
		int					sleepMs			= rnd.getInt(1, 200);
		vector<Thread*>		threads;

		for (int i = 0; i < numThreads; i++)
		{
			if (rnd.getBool())
				threads.push_back(new Consumer(&buffer, rnd.getUint32()));
			else
				threads.push_back(new Producer(&buffer, rnd.getUint32()));
		}

		// Start threads.
		for (vector<Thread*>::iterator i = threads.begin(); i != threads.end(); i++)
			(*i)->start();

		// Sleep for a while.
		deSleep(sleepMs);

		// Cancel buffer.
		buffer.cancel();

		// Wait for threads to finish.
		for (vector<Thread*>::iterator i = threads.begin(); i != threads.end(); i++)
			(*i)->join();

		// Reset buffer.
		buffer.clear();

		// Delete threads
		for (vector<Thread*>::iterator thread = threads.begin(); thread != threads.end(); ++thread)
			delete *thread;
	}
}